

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall UI::renderChannel(UI *this,Channel *channel,int width,bool selected)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  byte in_CL;
  int in_EDX;
  byte *in_RSI;
  ImVec2 *in_RDI;
  ImVec2 col;
  ImVec2 p0;
  bool result;
  int npop;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 local_38;
  ImVec2 in_stack_ffffffffffffffd0;
  int iVar4;
  
  iVar4 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12ec6f);
  ImGui::PushID((char *)in_stack_ffffffffffffffd0);
  col = ImGui::GetCursorScreenPos();
  if ((in_CL & 1) != 0) {
    ImGui::PushStyleColor(iVar4,(ImVec4 *)col);
    iVar4 = iVar4 + 1;
  }
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)in_EDX,1.0);
  bVar1 = ImGui::Button((char *)in_RDI,in_stack_ffffffffffffffb8);
  if (0 < *(int *)(in_RSI + 4)) {
    ImVec2::ImVec2(&local_38,(col.x + (float)in_EDX) - 6.0,col.y);
    ImGui::SetCursorScreenPos(in_RDI);
    ImGui::PushStyleColor(iVar4,(ImVec4 *)col);
    ImGui::PushStyleColor(iVar4,(ImVec4 *)col);
    ImGui::PushStyleColor(iVar4,(ImVec4 *)col);
    ImGui::PushStyleColor(iVar4,(ImVec4 *)col);
    sprintf(renderChannel::buf," %d ",(ulong)*(uint *)(in_RSI + 4));
    ImGui::SmallButton((char *)in_stack_ffffffffffffffd0);
    ImGui::PopStyleColor((int)((ulong)in_RDI >> 0x20));
  }
  bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_RDI);
  if ((((bVar2) || ((in_CL & 1) != 0)) || ((*in_RSI & 1) != 0)) || (0 < *(int *)(in_RSI + 4))) {
    ImGui::PushStyleColor(iVar4,(ImVec4 *)col);
  }
  ImGui::SetCursorScreenPos(in_RDI);
  iVar4 = (int)((ulong)in_RDI >> 0x20);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12ee20)
  ;
  ImGui::Text("# %s",pcVar3);
  ImGui::PopStyleColor(iVar4);
  ImGui::PopID();
  return bVar1;
}

Assistant:

bool UI::renderChannel(const Channel & channel, int width, bool selected) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(channel.label.c_str());
    const auto p0 = ImGui::GetCursorScreenPos();
    if (selected) {
        ImGui::PushStyleColor(ImGuiCol_Button, colors.channelSelectedBG);
        ++npop;
    }
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (channel.mentions > 0) {
        ImGui::SetCursorScreenPos({ p0.x + width - 6, p0.y });
        ImGui::PushStyleColor(ImGuiCol_Text,          colors.channelMentionsFG);
        ImGui::PushStyleColor(ImGuiCol_Button,        colors.channelMentionsBG);
        ImGui::PushStyleColor(ImGuiCol_ButtonHovered, colors.channelMentionsBG);
        ImGui::PushStyleColor(ImGuiCol_ButtonActive,  colors.channelMentionsBG);
        static char buf[16];
        sprintf(buf, " %d ", channel.mentions);
        ImGui::SmallButton(buf);
        ImGui::PopStyleColor(4);
    }
    if (ImGui::IsItemHovered() || selected || channel.hasUnread || channel.mentions > 0) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.channelActiveFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    ImGui::Text("# %s", channel.label.c_str());
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}